

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfGetLin(int64_t MshIdx,int KwdCod,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  KwdSct *kwd;
  GmfMshSct *msh;
  va_list VarArg;
  double DblVal;
  double *DblTab;
  double *PtrDbl;
  double *DblSolTab;
  float *PtrFlt;
  float FltVal;
  float *FltSolTab;
  int64_t LngVal;
  int IntVal;
  int *RefPtr;
  int *IntTab;
  int typ;
  int err;
  int i;
  void *in_stack_fffffffffffffd08;
  undefined4 **ptr;
  GmfMshSct *in_stack_fffffffffffffd10;
  GmfMshSct *msh_00;
  undefined8 *local_280;
  undefined8 *local_1e8;
  undefined8 *local_1d0;
  undefined8 *local_1b0;
  undefined8 *local_190;
  undefined8 *local_178;
  undefined1 local_158 [16];
  long local_148;
  long local_140;
  undefined4 *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined4 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  double local_78;
  long local_70;
  float *local_68;
  long local_60;
  float *local_58;
  float local_4c;
  long local_48;
  undefined1 local_40 [12];
  undefined4 local_34;
  undefined4 *local_30;
  long local_28;
  undefined4 local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Da;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  if (in_ESI < 0) {
    local_14 = -in_ESI;
    local_a8 = (undefined4 *)(in_RDI + 0x110 + (long)local_14 * 0x3300);
    local_20 = 5;
  }
  else {
    local_a8 = (undefined4 *)(in_RDI + 0x110 + (long)in_ESI * 0x3300);
    local_20 = *local_a8;
    local_14 = in_ESI;
  }
  if ((local_14 < 1) || (0xf0 < local_14)) {
    local_4 = 0;
  }
  else {
    local_148 = in_RDX;
    local_140 = in_RCX;
    local_138 = in_R8;
    local_130 = in_R9;
    local_a0 = in_RDI;
    local_10 = in_RDI;
    iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x48));
    if (iVar1 == 0) {
      local_88 = local_158;
      local_98._8_8_ = &stack0x00000008;
      local_98._4_4_ = 0x30;
      local_98._0_4_ = 0x10;
      switch(local_20) {
      case 1:
      case 2:
      case 4:
        if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
          local_1c = 0;
          for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
            if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'r') {
              if (*(int *)(local_a0 + 0x18) == 0x20) {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                ScaWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
              }
              else {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                ScaDblWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
              }
            }
            else if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'i') {
              if (*(int *)(local_a0 + 4) < 4) {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                ScaWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
              }
              else {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                ScaDblWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
              }
            }
            else if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'c') {
              if ((uint)local_98._0_4_ < 0x29) {
                local_280 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                local_98._0_4_ = local_98._0_4_ + 8;
              }
              else {
                local_280 = (undefined8 *)local_98._8_8_;
                local_98._8_8_ = local_98._8_8_ + 8;
              }
              sVar3 = fread((void *)*local_280,4,0x40,*(FILE **)(local_a0 + 0x300410));
              if (sVar3 != 0x40) {
                longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-3);
              }
            }
          }
        }
        else {
          local_1c = 0;
          for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
            if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'r') {
              if (*(int *)(local_a0 + 0x18) == 0x20) {
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%f",&local_4c);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
                if ((uint)local_98._0_4_ < 0x29) {
                  local_178 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_178 = (undefined8 *)local_98._8_8_;
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                local_68 = (float *)*local_178;
                *local_68 = local_4c;
                local_58 = local_68;
              }
              else {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_190 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_190 = (undefined8 *)local_98._8_8_;
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                local_68 = (float *)*local_190;
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%lf",local_68);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
            }
            else if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'i') {
              if (*(int *)(local_a0 + 4) < 4) {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_1b0 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_1b0 = (undefined8 *)local_98._8_8_;
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%d",*local_1b0);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
              else {
                if ((uint)local_98._0_4_ < 0x29) {
                  local_1d0 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                  local_98._0_4_ = local_98._0_4_ + 8;
                }
                else {
                  local_1d0 = (undefined8 *)local_98._8_8_;
                  local_98._8_8_ = local_98._8_8_ + 8;
                }
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%ld",*local_1d0);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
            }
            else if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'c') {
              if ((uint)local_98._0_4_ < 0x29) {
                local_1e8 = (undefined8 *)(local_88 + (int)local_98._0_4_);
                local_98._0_4_ = local_98._0_4_ + 8;
              }
              else {
                local_1e8 = (undefined8 *)local_98._8_8_;
                local_98._8_8_ = local_98._8_8_ + 8;
              }
              pcVar2 = fgets((char *)*local_1e8,0x40,*(FILE **)(local_a0 + 0x300410));
              if (pcVar2 == (char *)0x0) {
                longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-2);
              }
            }
          }
        }
        break;
      case 3:
        if (*(int *)(local_a0 + 0x18) == 0x20) {
          local_98._4_4_ = 0x30;
          local_98._0_4_ = 0x18;
          local_48 = local_148;
          if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
            local_1c = 0;
            for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
              ScaWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            }
          }
          else {
            local_1c = 0;
            for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
              iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%f",
                                      local_48 + (long)local_18 * 4);
              if (iVar1 != 1) {
                longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
              }
            }
          }
        }
        else {
          local_98._4_4_ = 0x30;
          local_98._0_4_ = 0x18;
          local_60 = local_148;
          if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
            local_1c = 0;
            for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
              ScaDblWrd(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            }
          }
          else {
            local_1c = 0;
            for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
              iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%lf",
                                      local_60 + (long)local_18 * 8);
              if (iVar1 != 1) {
                longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
              }
            }
          }
        }
        break;
      case 5:
        local_98._4_4_ = 0x30;
        local_28 = local_148;
        local_70 = local_140;
        msh_00 = (GmfMshSct *)local_98;
        ptr = &local_138;
        local_98._0_4_ = 0x28;
        local_30 = local_138;
        local_1c = 0;
        for (local_18 = 0; local_18 < (int)local_a8[3]; local_18 = local_18 + 1) {
          if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'i') {
            if (*(int *)(local_a0 + 4) < 4) {
              if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
                ScaWrd(msh_00,ptr);
              }
              else {
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%d",&local_34);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
            }
            else {
              if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
                ScaDblWrd(msh_00,ptr);
              }
              else {
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%ld",local_40);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
              local_34 = (undefined4)local_40._0_8_;
            }
            if ((F77RefFlg[local_14] == '\0') || (local_18 < local_a8[3] + -1)) {
              *(undefined4 *)(local_28 + (long)local_18 * 4) = local_34;
            }
            else {
              *local_30 = local_34;
            }
          }
          else if (*(char *)((long)local_a8 + (long)local_18 + 0xfd8) == 'r') {
            if (*(int *)(local_a0 + 0x18) == 0x20) {
              if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
                ScaWrd(msh_00,ptr);
              }
              else {
                iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%f",&local_4c);
                if (iVar1 != 1) {
                  longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
                }
              }
              local_78 = (double)local_4c;
            }
            else if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
              ScaDblWrd(msh_00,ptr);
            }
            else {
              iVar1 = __isoc99_fscanf(*(undefined8 *)(local_a0 + 0x300410),"%lf",&local_78);
              if (iVar1 != 1) {
                longjmp((__jmp_buf_tag *)(local_a0 + 0x48),-1);
              }
            }
            *(double *)(local_70 + (long)local_18 * 8) = local_78;
          }
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int GmfGetLin(int64_t MshIdx, int KwdCod, ...)
{
   int         i, err, typ, *IntTab, *RefPtr, IntVal;
   int64_t     LngVal;
   float       *FltSolTab, FltVal, *PtrFlt;
   double      *DblSolTab, *PtrDbl, *DblTab, DblVal;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                     PtrDbl = va_arg(VarArg, double *);
                     PtrFlt = (float *)PtrDbl;
                     *PtrFlt = FltVal;
                  }                     
                  else
                  {
                     PtrDbl = va_arg(VarArg, double *);
                     safe_fscanf(msh->hdl, "%lf",PtrDbl, msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     safe_fscanf(msh->hdl, "%d",
                        va_arg(VarArg, int *), msh->err);
                  }
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     safe_fscanf(msh->hdl, INT64_T_FMT,
                              va_arg(VarArg, int64_t *), msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  safe_fgets(va_arg(VarArg, char *), FilStrSiz, msh->hdl, msh->err);
               }
            }
         }
         else
         {
            for(i=0;i<kwd->SolSiz;i++)
               if(kwd->fmt[i] == 'r')
                  if(msh->FltSiz == 32)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, float *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, double *));
               else if(kwd->fmt[i] == 'i')
                  if(msh->ver <= 3)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, int *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, int64_t *));
               else if(kwd->fmt[i] == 'c')
                  // [Bruno] added error control
                  safe_fread(va_arg(VarArg, char *), WrdSiz, FilStrSiz, msh->hdl, msh->err);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%f", &FltSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaWrd(msh, (unsigned char *)&FltSolTab[i]);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%lf", &DblSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaDblWrd(msh, (unsigned char *)&DblSolTab[i]);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         for(i=0;i<kwd->SolSiz;i++)
         {
            if(kwd->fmt[i] == 'i')
            {
               if(msh->ver <= 3)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%d", &IntVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&IntVal);
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, INT64_T_FMT, &LngVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&LngVal);

                  IntVal = (int)LngVal;
               }

               if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                  IntTab[i] = IntVal;
               else
                  *RefPtr = IntVal;
            }
            else if(kwd->fmt[i] == 'r')
            {
               if(msh->FltSiz == 32)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&FltVal);

                  DblVal = (double)FltVal;
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%lf", &DblVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&DblVal);
               }

               DblTab[i] = DblVal;
            }
         }
      }break;
   }

   va_end(VarArg);

   return(1);
}